

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall flow::LoadInstr::LoadInstr(LoadInstr *this,Value *variable,string *name)

{
  initializer_list<flow::Value_*> __l;
  LiteralType ty;
  allocator<flow::Value_*> local_51;
  Value *local_50;
  iterator local_48;
  size_type local_40;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  string *local_20;
  string *name_local;
  Value *variable_local;
  LoadInstr *this_local;
  
  local_20 = name;
  name_local = (string *)variable;
  variable_local = (Value *)this;
  ty = Value::type(variable);
  local_50 = (Value *)name_local;
  local_48 = &local_50;
  local_40 = 1;
  std::allocator<flow::Value_*>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_38,__l,&local_51);
  Instr::Instr(&this->super_Instr,ty,&local_38,local_20);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_38);
  std::allocator<flow::Value_*>::~allocator(&local_51);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__LoadInstr_002ba4a0;
  return;
}

Assistant:

LoadInstr(Value* variable, const std::string& name)
      : Instr(variable->type(), {variable}, name) {}